

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O3

int read_StreamsInfo(archive_read *a,_7z_stream_info *si)

{
  _7z_coders_info *val;
  byte bVar1;
  void *pvVar2;
  archive_read *a_00;
  uchar uVar3;
  int iVar4;
  uchar *puVar5;
  uint64_t *puVar6;
  uint64_t *puVar7;
  _7z_folder *p_Var8;
  _7z_coder *p_Var9;
  byte *pbVar10;
  uchar *__dest;
  anon_struct_16_2_4d417c8e *paVar11;
  ulong *puVar12;
  uint64_t *puVar13;
  uint32_t *puVar14;
  uint64_t uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  size_t num;
  ulong uVar20;
  uint uVar21;
  _7z_folder *p_Var22;
  uint uVar23;
  uint uVar24;
  size_t sVar25;
  bool bVar26;
  ulong local_70;
  _7z_digests local_68;
  ulong local_58;
  archive_read *local_50;
  uint64_t local_48;
  ulong local_40;
  void *local_38;
  
  pvVar2 = a->format->data;
  (si->ss).unpackSizes = (uint64_t *)0x0;
  (si->ss).digestsDefined = (uchar *)0x0;
  (si->ci).dataStreamIndex = 0;
  (si->ss).unpack_streams = 0;
  (si->ci).numFolders = 0;
  (si->ci).folders = (_7z_folder *)0x0;
  (si->pi).digest.digests = (uint32_t *)0x0;
  (si->pi).positions = (uint64_t *)0x0;
  (si->pi).sizes = (uint64_t *)0x0;
  (si->pi).digest.defineds = (uchar *)0x0;
  (si->pi).pos = 0;
  (si->pi).numPackStreams = 0;
  (si->ss).digests = (uint32_t *)0x0;
  puVar5 = header_bytes(a,1);
  if (puVar5 == (uchar *)0x0) {
    return -1;
  }
  uVar3 = *puVar5;
  if (uVar3 == '\x06') {
    (si->pi).digest.digests = (uint32_t *)0x0;
    (si->pi).positions = (uint64_t *)0x0;
    (si->pi).sizes = (uint64_t *)0x0;
    (si->pi).digest.defineds = (uchar *)0x0;
    (si->pi).pos = 0;
    (si->pi).numPackStreams = 0;
    iVar4 = parse_7zip_uint64(a,(uint64_t *)si);
    if (iVar4 < 0) {
      return -1;
    }
    puVar13 = &(si->pi).numPackStreams;
    iVar4 = parse_7zip_uint64(a,puVar13);
    if (iVar4 < 0) {
      return -1;
    }
    if (*puVar13 - 0x5f5e101 < 0xfffffffffa0a1f00) {
      return -1;
    }
    puVar5 = header_bytes(a,1);
    if (puVar5 == (uchar *)0x0) {
      return -1;
    }
    if (*puVar5 != '\0') {
      if (*puVar5 != '\t') {
        return -1;
      }
      sVar25 = (si->pi).numPackStreams;
      local_50 = a;
      puVar6 = (uint64_t *)calloc(sVar25,8);
      (si->pi).sizes = puVar6;
      puVar7 = (uint64_t *)calloc(sVar25,8);
      a = local_50;
      (si->pi).positions = puVar7;
      if (puVar7 == (uint64_t *)0x0 || puVar6 == (uint64_t *)0x0) {
        return -1;
      }
      if (sVar25 != 0) {
        uVar21 = 1;
        uVar18 = 0;
        do {
          iVar4 = parse_7zip_uint64(a,(si->pi).sizes + uVar18);
          if (iVar4 < 0) {
            return -1;
          }
          uVar18 = (ulong)uVar21;
          uVar21 = uVar21 + 1;
        } while (uVar18 < *puVar13);
      }
      puVar5 = header_bytes(a,1);
      if (puVar5 == (uchar *)0x0) {
        return -1;
      }
      if (*puVar5 == '\0') {
        sVar25 = (si->pi).numPackStreams;
        puVar5 = (uchar *)calloc(sVar25,1);
        a = local_50;
        (si->pi).digest.defineds = puVar5;
        puVar14 = (uint32_t *)calloc(sVar25,4);
        (si->pi).digest.digests = puVar14;
        if (puVar14 == (uint32_t *)0x0 || puVar5 == (uchar *)0x0) {
          return -1;
        }
      }
      else {
        if (*puVar5 != '\n') {
          return -1;
        }
        iVar4 = read_Digests(a,&(si->pi).digest,(si->pi).numPackStreams);
        if (iVar4 < 0) {
          return -1;
        }
        puVar5 = header_bytes(a,1);
        if (puVar5 == (uchar *)0x0) {
          return -1;
        }
        if (*puVar5 != '\0') {
          return -1;
        }
      }
    }
    puVar6 = (si->pi).positions;
    if (puVar6 == (uint64_t *)0x0) {
      return -1;
    }
    puVar7 = (si->pi).sizes;
    if (puVar7 == (uint64_t *)0x0) {
      return -1;
    }
    if (*puVar13 != 0) {
      uVar18 = (si->pi).pos;
      uVar21 = 1;
      uVar16 = 0;
      do {
        puVar6[uVar16] = uVar18;
        puVar12 = puVar7 + uVar16;
        bVar26 = CARRY8(uVar18,*puVar12);
        uVar18 = uVar18 + *puVar12;
        if (bVar26) {
          return -1;
        }
        if (*(ulong *)((long)pvVar2 + 0x80) < uVar18) {
          return -1;
        }
        uVar16 = (ulong)uVar21;
        uVar21 = uVar21 + 1;
      } while (uVar16 < *puVar13);
    }
    puVar5 = header_bytes(a,1);
    if (puVar5 == (uchar *)0x0) {
      return -1;
    }
    uVar3 = *puVar5;
  }
  if (uVar3 != '\a') goto LAB_00237159;
  (si->ci).numFolders = 0;
  (si->ci).folders = (_7z_folder *)0x0;
  (si->ci).dataStreamIndex = 0;
  local_68.defineds = (uchar *)0x0;
  local_68.digests = (uint32_t *)0x0;
  puVar5 = header_bytes(a,1);
  if ((puVar5 == (uchar *)0x0) || (*puVar5 != '\v')) goto LAB_0023700d;
  val = &si->ci;
  iVar4 = parse_7zip_uint64(a,&val->numFolders);
  if (iVar4 < 0) goto LAB_0023700d;
  if (100000000 < val->numFolders) {
    return -1;
  }
  puVar5 = header_bytes(a,1);
  if (puVar5 == (uchar *)0x0) goto LAB_0023700d;
  if (*puVar5 == '\x01') {
    puVar13 = &(si->ci).dataStreamIndex;
    iVar4 = parse_7zip_uint64(a,puVar13);
    if (iVar4 < 0) {
      return -1;
    }
    if (100000000 < *puVar13) {
      return -1;
    }
    if (val->numFolders != 0) goto LAB_00236ff7;
  }
  else {
    if (*puVar5 != '\0') {
LAB_00236ff7:
      archive_set_error(&a->archive,-1,"Malformed 7-Zip archive");
      goto LAB_0023700d;
    }
    sVar25 = (si->ci).numFolders;
    p_Var8 = (_7z_folder *)calloc(sVar25,0x68);
    (si->ci).folders = p_Var8;
    if (p_Var8 == (_7z_folder *)0x0) {
      return -1;
    }
    if (sVar25 != 0) {
      uVar18 = 0;
      do {
        p_Var22 = (si->ci).folders;
        p_Var8 = p_Var22 + uVar18;
        local_38 = a->format->data;
        p_Var22[uVar18].numUnpackStreams = 0;
        (&p_Var22[uVar18].numUnpackStreams)[1] = 0;
        p_Var22[uVar18].unPackSize = (uint64_t *)0x0;
        (&p_Var22[uVar18].unPackSize)[1] = (uint64_t *)0x0;
        p_Var22[uVar18].numInStreams = 0;
        (&p_Var22[uVar18].numInStreams)[1] = 0;
        p_Var22[uVar18].numPackedStreams = 0;
        (&p_Var22[uVar18].numPackedStreams)[1] = 0;
        p_Var22[uVar18].numBindPairs = 0;
        (&p_Var22[uVar18].numBindPairs)[1] = 0;
        p_Var22[uVar18].numCoders = 0;
        p_Var22[uVar18].coders = (_7z_coder *)0x0;
        p_Var22[uVar18].skipped_bytes = 0;
        local_40 = uVar18;
        iVar4 = parse_7zip_uint64(a,&p_Var8->numCoders);
        if ((iVar4 < 0) || (uVar18 = p_Var8->numCoders, 4 < uVar18)) goto LAB_0023700d;
        p_Var9 = (_7z_coder *)calloc(uVar18,0x28);
        p_Var8->coders = p_Var9;
        if ((uVar18 == 0) || (p_Var9 == (_7z_coder *)0x0)) goto LAB_0023700d;
        local_58 = 0;
        local_70 = 0;
        local_48 = 0;
        do {
          pbVar10 = header_bytes(a,1);
          if (pbVar10 == (byte *)0x0) goto LAB_0023700d;
          bVar1 = *pbVar10;
          if ((char)bVar1 < '\0') goto LAB_0023700d;
          puVar5 = header_bytes(a,(ulong)(bVar1 & 0xf));
          uVar18 = local_58;
          if (puVar5 == (uchar *)0x0) goto LAB_0023700d;
          if ((bVar1 & 0xf) == 0) {
            uVar16 = 0;
          }
          else {
            uVar19 = 0;
            uVar16 = 0;
            do {
              uVar16 = uVar16 << 8 | (ulong)puVar5[uVar19];
              uVar19 = uVar19 + 1;
            } while ((bVar1 & 0xf) != uVar19);
          }
          p_Var9 = p_Var8->coders;
          puVar13 = &p_Var9[local_58].numInStreams;
          p_Var9[local_58].codec = uVar16;
          if ((bVar1 & 0x10) == 0) {
            *puVar13 = 1;
            p_Var9[local_58].numOutStreams = 1;
          }
          else {
            iVar4 = parse_7zip_uint64(a,puVar13);
            if ((((iVar4 < 0) || (100000000 < p_Var8->coders[uVar18].numInStreams)) ||
                (iVar4 = parse_7zip_uint64(a,&p_Var8->coders[uVar18].numOutStreams), iVar4 < 0)) ||
               (p_Var9 = p_Var8->coders, 100000000 < p_Var9[uVar18].numOutStreams))
            goto LAB_0023700d;
          }
          if ((bVar1 & 0x20) != 0) {
            iVar4 = parse_7zip_uint64(a,&p_Var9[uVar18].propertiesSize);
            if (((iVar4 < 0) || (uVar16 = p_Var8->coders[uVar18].propertiesSize, 100000000 < uVar16)
                ) || (puVar5 = header_bytes(a,uVar16), puVar5 == (uchar *)0x0)) goto LAB_0023700d;
            p_Var9 = p_Var8->coders;
            sVar25 = p_Var9[uVar18].propertiesSize;
            __dest = (uchar *)malloc(sVar25);
            p_Var9[uVar18].properties = __dest;
            if (__dest == (uchar *)0x0) goto LAB_0023700d;
            memcpy(__dest,puVar5,sVar25);
          }
          local_70 = local_70 + p_Var9[uVar18].numInStreams;
          local_48 = local_48 + p_Var9[uVar18].numOutStreams;
          local_58 = (ulong)((int)local_58 + 1);
        } while (local_58 < p_Var8->numCoders);
        if (((local_48 == 0) || (sVar25 = local_48 - 1, local_70 < sVar25)) ||
           (p_Var8->numBindPairs = sVar25, *(ulong *)((long)local_38 + 0x70) < sVar25))
        goto LAB_0023700d;
        if (sVar25 == 0) {
          p_Var8->bindPairs = (anon_struct_16_2_4d417c8e *)0x0;
          paVar11 = (anon_struct_16_2_4d417c8e *)0x0;
          uVar18 = 0;
        }
        else {
          paVar11 = (anon_struct_16_2_4d417c8e *)calloc(sVar25,0x10);
          p_Var8->bindPairs = paVar11;
          if (paVar11 == (anon_struct_16_2_4d417c8e *)0x0) goto LAB_0023700d;
          uVar16 = 0;
          uVar19 = 1;
          do {
            iVar4 = parse_7zip_uint64(a,&paVar11[uVar16].inIndex);
            if ((((iVar4 < 0) || (100000000 < p_Var8->bindPairs[uVar16].inIndex)) ||
                (iVar4 = parse_7zip_uint64(a,&p_Var8->bindPairs[uVar16].outIndex), iVar4 < 0)) ||
               (paVar11 = p_Var8->bindPairs, 100000000 < paVar11[uVar16].outIndex))
            goto LAB_0023700d;
            uVar18 = p_Var8->numBindPairs;
            bVar26 = uVar19 < uVar18;
            uVar16 = uVar19;
            uVar19 = (ulong)((int)uVar19 + 1);
          } while (bVar26);
        }
        sVar25 = local_70 - uVar18;
        p_Var8->numPackedStreams = sVar25;
        puVar12 = (ulong *)calloc(sVar25,8);
        p_Var8->packedStreams = puVar12;
        if (puVar12 == (ulong *)0x0) goto LAB_0023700d;
        if (sVar25 == 1) {
          if (local_70 == 0) goto LAB_0023700d;
          uVar16 = 0;
          do {
            if (uVar18 == 0) {
              uVar19 = 0;
            }
            else {
              uVar21 = 1;
              uVar19 = 0;
              do {
                if (paVar11[uVar19].inIndex == uVar16) break;
                uVar19 = (ulong)uVar21;
                uVar21 = uVar21 + 1;
              } while (uVar19 < uVar18);
            }
          } while ((uVar18 != uVar19) && (uVar16 = (ulong)((int)uVar16 + 1), uVar16 < local_70));
          if (local_70 == uVar16) goto LAB_0023700d;
          *puVar12 = uVar16;
        }
        else if (local_70 != uVar18) {
          uVar21 = 1;
          uVar18 = 0;
          do {
            iVar4 = parse_7zip_uint64(a,puVar12 + uVar18);
            if ((iVar4 < 0) || (puVar12 = p_Var8->packedStreams, 100000000 < puVar12[uVar18]))
            goto LAB_0023700d;
            uVar18 = (ulong)uVar21;
            uVar21 = uVar21 + 1;
          } while (uVar18 < p_Var8->numPackedStreams);
        }
        p_Var8->numInStreams = local_70;
        p_Var8->numOutStreams = local_48;
        uVar18 = (ulong)((int)local_40 + 1);
      } while (uVar18 < val->numFolders);
    }
  }
  puVar5 = header_bytes(a,1);
  if ((puVar5 != (uchar *)0x0) && (*puVar5 == '\f')) {
    uVar15 = val->numFolders;
    if (uVar15 != 0) {
      uVar18 = 0;
      do {
        p_Var8 = (si->ci).folders;
        sVar25 = p_Var8[uVar18].numOutStreams;
        puVar13 = (uint64_t *)calloc(sVar25,8);
        p_Var8[uVar18].unPackSize = puVar13;
        if (puVar13 == (uint64_t *)0x0) goto LAB_0023700d;
        if (sVar25 != 0) {
          uVar16 = 0;
          uVar19 = 1;
          do {
            iVar4 = parse_7zip_uint64(a,p_Var8[uVar18].unPackSize + uVar16);
            if (iVar4 < 0) goto LAB_0023700d;
            bVar26 = uVar19 < p_Var8[uVar18].numOutStreams;
            uVar16 = uVar19;
            uVar19 = (ulong)((int)uVar19 + 1);
          } while (bVar26);
          uVar15 = val->numFolders;
        }
        uVar18 = (ulong)((int)uVar18 + 1);
      } while (uVar18 < uVar15);
    }
    puVar5 = header_bytes(a,1);
    if (puVar5 != (uchar *)0x0) {
      if (*puVar5 == '\n') {
        iVar4 = read_Digests(a,&local_68,val->numFolders);
        if (iVar4 < 0) goto LAB_0023700d;
        uVar18 = val->numFolders;
        if (uVar18 != 0) {
          puVar14 = &((si->ci).folders)->digest;
          uVar16 = 0;
          do {
            *(uchar *)(puVar14 + -1) = local_68.defineds[uVar16];
            *puVar14 = local_68.digests[uVar16];
            uVar16 = uVar16 + 1;
            puVar14 = puVar14 + 0x1a;
          } while ((uVar16 & 0xffffffff) < uVar18);
        }
        puVar5 = header_bytes(a,1);
        if ((puVar5 == (uchar *)0x0) || (*puVar5 != '\0')) goto LAB_0023700d;
        free(local_68.defineds);
        free(local_68.digests);
      }
      else if (*puVar5 != '\0') goto LAB_0023700d;
      uVar18 = (si->ci).numFolders;
      if (uVar18 != 0) {
        p_Var8 = (si->ci).folders;
        uVar19 = 0;
        uVar21 = 1;
        uVar16 = 0;
        do {
          uVar23 = (uint)uVar16;
          p_Var8[uVar19].packIndex = uVar23;
          uVar16 = p_Var8[uVar19].numPackedStreams;
          if (uVar16 >> 0x20 != 0) {
            return -1;
          }
          uVar24 = (uint)uVar16;
          uVar16 = (ulong)(uVar23 + uVar24);
          if (CARRY4(uVar23,uVar24)) {
            return -1;
          }
          if ((si->pi).numPackStreams < uVar16) {
            return -1;
          }
          uVar19 = (ulong)uVar21;
          uVar21 = uVar21 + 1;
        } while (uVar19 < uVar18);
      }
      puVar5 = header_bytes(a,1);
      if (puVar5 == (uchar *)0x0) {
        return -1;
      }
      uVar3 = *puVar5;
LAB_00237159:
      if (uVar3 == '\b') {
        uVar18 = (si->ci).numFolders;
        p_Var8 = (si->ci).folders;
        (si->ss).unpack_streams = 0;
        (si->ss).unpackSizes = (uint64_t *)0x0;
        (si->ss).digestsDefined = (uchar *)0x0;
        (si->ss).digests = (uint32_t *)0x0;
        if (uVar18 != 0) {
          puVar13 = &p_Var8->numUnpackStreams;
          uVar16 = 1;
          do {
            *puVar13 = 1;
            puVar13 = puVar13 + 0xd;
            bVar26 = uVar16 < uVar18;
            uVar16 = (ulong)((int)uVar16 + 1);
          } while (bVar26);
        }
        puVar5 = header_bytes(a,1);
        if (puVar5 == (uchar *)0x0) {
          return -1;
        }
        uVar3 = *puVar5;
        uVar16 = uVar18;
        if (uVar3 == '\r') {
          if (uVar18 == 0) {
            uVar16 = 0;
          }
          else {
            uVar16 = 0;
            uVar19 = 0;
            uVar20 = 1;
            do {
              iVar4 = parse_7zip_uint64(a,&p_Var8[uVar19].numUnpackStreams);
              if (iVar4 < 0) {
                return -1;
              }
              uVar19 = p_Var8[uVar19].numUnpackStreams;
              if (100000000 < uVar19) {
                return -1;
              }
              if (0xfffffffffa0a1eff < uVar16) {
                return -1;
              }
              uVar16 = uVar16 + uVar19;
              bVar26 = uVar20 < uVar18;
              uVar19 = uVar20;
              uVar20 = (ulong)((int)uVar20 + 1);
            } while (bVar26);
          }
          puVar5 = header_bytes(a,1);
          if (puVar5 == (uchar *)0x0) {
            return -1;
          }
          uVar3 = *puVar5;
        }
        (si->ss).unpack_streams = uVar16;
        local_50 = a;
        if (uVar16 != 0) {
          puVar13 = (uint64_t *)calloc(uVar16,8);
          (si->ss).unpackSizes = puVar13;
          puVar5 = (uchar *)calloc(uVar16,1);
          (si->ss).digestsDefined = puVar5;
          puVar14 = (uint32_t *)calloc(uVar16,4);
          (si->ss).digests = puVar14;
          if (puVar13 == (uint64_t *)0x0) {
            return -1;
          }
          if (puVar14 == (uint32_t *)0x0 || puVar5 == (uchar *)0x0) {
            return -1;
          }
        }
        if (uVar18 != 0) {
          puVar13 = (si->ss).unpackSizes;
          uVar19 = 0;
          do {
            if (p_Var8[uVar19].numUnpackStreams != 0) {
              p_Var22 = p_Var8 + uVar19;
              local_58 = uVar19;
              if ((uVar3 == '\t') && (p_Var8[uVar19].numUnpackStreams != 1)) {
                uVar19 = 0;
                uVar20 = 2;
                do {
                  iVar4 = parse_7zip_uint64(local_50,puVar13);
                  if (iVar4 < 0) {
                    return -1;
                  }
                  bVar26 = CARRY8(uVar19,*puVar13);
                  uVar19 = uVar19 + *puVar13;
                  if (bVar26) {
                    return -1;
                  }
                  puVar13 = puVar13 + 1;
                  bVar26 = uVar20 < p_Var22->numUnpackStreams;
                  uVar20 = (ulong)((int)uVar20 + 1);
                } while (bVar26);
                uVar15 = folder_uncompressed_size(p_Var22);
                if (uVar15 < uVar19) {
                  return -1;
                }
              }
              else {
                uVar15 = folder_uncompressed_size(p_Var22);
                uVar19 = 0;
              }
              *puVar13 = uVar15 - uVar19;
              puVar13 = puVar13 + 1;
              uVar19 = local_58;
            }
            uVar19 = (ulong)((int)uVar19 + 1);
          } while (uVar19 < uVar18);
        }
        a_00 = local_50;
        if (uVar3 == '\t') {
          puVar5 = header_bytes(local_50,1);
          if (puVar5 == (uchar *)0x0) {
            return -1;
          }
          uVar3 = *puVar5;
        }
        if (uVar16 != 0) {
          uVar19 = 0;
          do {
            (si->ss).digestsDefined[uVar19] = '\0';
            (si->ss).digests[uVar19] = 0;
            uVar19 = uVar19 + 1;
          } while ((uVar19 & 0xffffffff) < uVar16);
        }
        num = 0;
        if (uVar18 != 0) {
          puVar13 = &p_Var8->numUnpackStreams;
          uVar16 = 1;
          do {
            if ((*puVar13 != 1) || (*(uchar *)(puVar13 + -1) == '\0')) {
              num = (size_t)(uint)((int)num + (int)*puVar13);
            }
            puVar13 = puVar13 + 0xd;
            bVar26 = uVar16 < uVar18;
            uVar16 = (ulong)((int)uVar16 + 1);
          } while (bVar26);
        }
        if (uVar3 == '\n') {
          puVar5 = (si->ss).digestsDefined;
          puVar14 = (si->ss).digests;
          local_68.defineds = (uchar *)0x0;
          local_68.digests = (uint32_t *)0x0;
          iVar4 = read_Digests(a_00,&local_68,num);
          if (iVar4 < 0) {
            free(local_68.defineds);
            free(local_68.digests);
            return -1;
          }
          if (uVar18 != 0) {
            uVar16 = 0;
            lVar17 = 0;
            do {
              if (p_Var8[uVar16].numUnpackStreams != 0) {
                if ((p_Var8[uVar16].numUnpackStreams == 1) &&
                   (p_Var8[uVar16].digest_defined != '\0')) {
                  *puVar5 = '\x01';
                  puVar5 = puVar5 + 1;
                  *puVar14 = p_Var8[uVar16].digest;
                  puVar14 = puVar14 + 1;
                }
                else {
                  lVar17 = (long)(int)lVar17;
                  uVar21 = 1;
                  do {
                    *puVar5 = local_68.defineds[lVar17];
                    puVar5 = puVar5 + 1;
                    *puVar14 = local_68.digests[lVar17];
                    puVar14 = puVar14 + 1;
                    lVar17 = lVar17 + 1;
                    uVar19 = (ulong)uVar21;
                    uVar21 = uVar21 + 1;
                  } while (uVar19 < p_Var8[uVar16].numUnpackStreams);
                }
              }
              uVar16 = uVar16 + 1;
            } while ((uVar16 & 0xffffffff) < uVar18);
          }
          free(local_68.defineds);
          free(local_68.digests);
          puVar5 = header_bytes(a_00,1);
          if (puVar5 == (uchar *)0x0) {
            return -1;
          }
          uVar3 = *puVar5;
        }
        if (uVar3 != '\0') {
          return -1;
        }
        puVar5 = header_bytes(a_00,1);
        if (puVar5 == (uchar *)0x0) {
          return -1;
        }
        uVar3 = *puVar5;
      }
      return -(uint)(uVar3 != '\0');
    }
  }
LAB_0023700d:
  free(local_68.defineds);
  free(local_68.digests);
  return -1;
}

Assistant:

static int
read_StreamsInfo(struct archive_read *a, struct _7z_stream_info *si)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	const unsigned char *p;
	unsigned i;

	memset(si, 0, sizeof(*si));

	if ((p = header_bytes(a, 1)) == NULL)
		return (-1);
	if (*p == kPackInfo) {
		uint64_t packPos;

		if (read_PackInfo(a, &(si->pi)) < 0)
			return (-1);

		if (si->pi.positions == NULL || si->pi.sizes == NULL)
			return (-1);
		/*
		 * Calculate packed stream positions.
		 */
		packPos = si->pi.pos;
		for (i = 0; i < si->pi.numPackStreams; i++) {
			si->pi.positions[i] = packPos;
			if (packPos > UINT64_MAX - si->pi.sizes[i])
				return (-1);
			packPos += si->pi.sizes[i];
			if (packPos > zip->header_offset)
				return (-1);
		}
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}
	if (*p == kUnPackInfo) {
		uint32_t packIndex;
		struct _7z_folder *f;

		if (read_CodersInfo(a, &(si->ci)) < 0)
			return (-1);

		/*
		 * Calculate packed stream indexes.
		 */
		packIndex = 0;
		f = si->ci.folders;
		for (i = 0; i < si->ci.numFolders; i++) {
			f[i].packIndex = packIndex;
			if (f[i].numPackedStreams > UINT32_MAX)
				return (-1);
			if (packIndex > UINT32_MAX - (uint32_t)f[i].numPackedStreams)
				return (-1);
			packIndex += (uint32_t)f[i].numPackedStreams;
			if (packIndex > si->pi.numPackStreams)
				return (-1);
		}
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}

	if (*p == kSubStreamsInfo) {
		if (read_SubStreamsInfo(a, &(si->ss),
		    si->ci.folders, (size_t)si->ci.numFolders) < 0)
			return (-1);
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}

	/*
	 *  Must be kEnd.
	 */
	if (*p != kEnd)
		return (-1);
	return (0);
}